

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_vx.inc.c
# Opt level: O0

DisasJumpType op_vsra(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx_00;
  int iVar1;
  uint32_t dofs;
  uint32_t aofs;
  TCGv_i64 dst;
  TCGv_i64 shift;
  TCGContext_conflict12 *tcg_ctx;
  DisasOps *o_local;
  DisasContext_conflict13 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  dst = tcg_temp_new_i64(tcg_ctx_00);
  iVar1 = get_field1(s,FLD_O_v3,FLD_C_i3);
  read_vec_element_i64(tcg_ctx_00,dst,(uint8_t)iVar1,'\a',MO_8);
  if ((*(uint *)&(s->fields).field_0x8 >> 8 & 0xff) == 0x7e) {
    tcg_gen_andi_i64_s390x(tcg_ctx_00,dst,dst,7);
  }
  else {
    tcg_gen_andi_i64_s390x(tcg_ctx_00,dst,dst,0x78);
  }
  iVar1 = get_field1(s,FLD_O_v1,FLD_C_b1);
  dofs = vec_full_reg_offset((uint8_t)iVar1);
  iVar1 = get_field1(s,FLD_O_v2,FLD_C_d4);
  aofs = vec_full_reg_offset((uint8_t)iVar1);
  tcg_gen_gvec_2i_ool_s390x(tcg_ctx_00,dofs,aofs,dst,0x10,0x10,0,gen_helper_gvec_vsra);
  tcg_temp_free_i64(tcg_ctx_00,dst);
  return DISAS_NEXT;
}

Assistant:

static DisasJumpType op_vsra(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i64 shift = tcg_temp_new_i64(tcg_ctx);

    read_vec_element_i64(tcg_ctx, shift, get_field(s, v3), 7, ES_8);
    if (s->fields.op2 == 0x7e) {
        tcg_gen_andi_i64(tcg_ctx, shift, shift, 0x7);
    } else {
        tcg_gen_andi_i64(tcg_ctx, shift, shift, 0x78);
    }

    gen_gvec_2i_ool(tcg_ctx, get_field(s, v1), get_field(s, v2),
                    shift, 0, gen_helper_gvec_vsra);
    tcg_temp_free_i64(tcg_ctx, shift);
    return DISAS_NEXT;
}